

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationAngle.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationAngle::ChLinkMotorRotationAngle(ChLinkMotorRotationAngle *this)

{
  __shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2> local_30;
  undefined8 local_20;
  double local_18;
  
  ChLinkMotorRotation::ChLinkMotorRotation(&this->super_ChLinkMotorRotation);
  *(undefined ***)
   &(this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.super_ChLinkMate.
    super_ChLink.super_ChLinkBase.super_ChPhysicsItem = &PTR__ChLinkMotorRotationAngle_0116a070;
  local_18 = 0.0;
  local_20 = 0x3ff0000000000000;
  std::make_shared<chrono::ChFunction_Ramp,double,double>((double *)&local_30,&local_18);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_ChLinkMotorRotation).super_ChLinkMotor.m_func,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  *(undefined8 *)&(this->super_ChLinkMotorRotation).field_0x278 = 0;
  return;
}

Assistant:

ChLinkMotorRotationAngle::ChLinkMotorRotationAngle() {
    // default motion function: ramp with initial value y(0) = 0 and slope dy/dt = 1
    m_func = chrono_types::make_shared<ChFunction_Ramp>(0.0, 1.0);

    rot_offset = 0;
}